

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O3

task_priority __thiscall
oqpi::scheduler<concurrent_queue>::resolveTaskPriority
          (scheduler<concurrent_queue> *this,task_handle *hTask)

{
  code *pcVar1;
  task_priority tVar2;
  eAssertResult eVar3;
  element_type *peVar4;
  
  task_handle::validate(hTask);
  tVar2 = ((hTask->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->priority_;
  if (tVar2 == inherit) {
    task_handle::validate(hTask);
    peVar4 = (hTask->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    do {
      peVar4 = *(element_type **)&peVar4->spParentGroup_;
      if (peVar4 == (element_type *)0x0) {
        task_handle::validate(hTask);
        eVar3 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/scheduler.hpp"
                                ,0xd6,"pParentGroup != nullptr",
                                "One parent group is invalid for this task: %d");
        if (eVar3 != eAR_Retry) {
          return normal;
        }
        pcVar1 = (code *)swi(3);
        tVar2 = (*pcVar1)();
        return tVar2;
      }
      tVar2 = peVar4->priority_;
    } while (tVar2 == inherit);
  }
  return tVar2;
}

Assistant:

task_priority resolveTaskPriority(const task_handle &hTask)
        {
            task_priority priority = hTask.getPriority();

            if (priority == task_priority::inherit)
            {
                auto pParentGroup = hTask.getParentGroup().get();
                do 
                {
                    if (oqpi_failedf(pParentGroup != nullptr, "One parent group is invalid for this task: %d", hTask.getUID()))
                    {
                         priority = task_priority::normal;
                        break;
                    }

                    priority     = pParentGroup->getPriority();
                    pParentGroup = pParentGroup->getParentGroup().get();

                } while (priority == task_priority::inherit);
            }

            return priority;
        }